

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

uint * __thiscall
Lib::Map<Kernel::Variable,_unsigned_int,_Lib::StlHash>::get
          (Map<Kernel::Variable,_unsigned_int,_Lib::StlHash> *this,SymbolId key)

{
  bool bVar1;
  uint code_00;
  Entry *this_00;
  uint *puVar2;
  Map<Kernel::Variable,_unsigned_int,_Lib::StlHash> *in_RDI;
  Entry *entry;
  uint code;
  Map<Kernel::Variable,_unsigned_int,_Lib::StlHash> *in_stack_ffffffffffffffe0;
  
  code_00 = hashCode(in_stack_ffffffffffffffe0,(SymbolId *)in_RDI);
  this_00 = firstEntryForCode(in_RDI,code_00);
  while( true ) {
    Entry::key(this_00);
    bVar1 = StlHash::equals<Kernel::Variable>((SymbolId *)this_00,(SymbolId *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = nextEntry(in_RDI,this_00);
  }
  puVar2 = Entry::value(this_00);
  return puVar2;
}

Assistant:

Val& get(Key key) const
  {
    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); !Hash::equals(entry->key(),key); entry = nextEntry(entry)) {
      ASS(entry->occupied());
    }
    ASS(entry->occupied());
    return entry->value();
  }